

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O1

int th06_compile(thecl_t *ecl,FILE *out)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  int *piVar5;
  undefined1 uVar6;
  ushort uVar7;
  undefined2 uVar8;
  int iVar9;
  uint32_t uVar10;
  int32_t iVar11;
  long lVar12;
  list_node_t *plVar13;
  undefined4 *buffer;
  size_t sVar14;
  char *out_00;
  char *in;
  ssize_t sVar15;
  undefined2 *buffer_00;
  uchar uVar16;
  size_t __nmemb;
  uint32_t *data;
  undefined8 *buffer_01;
  uchar *data_00;
  thecl_sub_t *ptVar17;
  long *plVar18;
  ulong uVar19;
  long *plVar20;
  bool bVar21;
  char timeline_sentinel_th6 [4];
  uint32_t magic;
  char timeline_sentinel_th8 [8];
  th06_instr_t sentinel;
  undefined2 local_c0;
  ushort local_be;
  uint local_bc;
  thecl_sub_t *local_b8;
  void *local_b0;
  FILE *local_a8;
  undefined4 local_a0;
  int local_9c;
  long local_98;
  list_node_t *local_90;
  value_t local_88;
  ulong local_68;
  void *local_60;
  list_node_t *local_58;
  list_node_t *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  uVar1 = ecl->version;
  local_9c = (uVar1 == 9 | 8) << 8;
  uVar3 = ecl->sub_count;
  local_c0 = (undefined2)uVar3;
  local_40 = 0xcffffffffffff;
  local_38 = 0xffff00;
  local_90 = (list_node_t *)&ecl->timelines;
  local_be = 0xffff;
  plVar13 = local_90;
  do {
    plVar13 = plVar13->next;
    local_be = local_be + 1;
  } while (plVar13 != (list_node_t *)0x0);
  if (uVar1 == 6) {
    local_be = 0;
    uVar19 = 3;
  }
  else {
    uVar19 = 0x10;
    if (uVar1 == 9) {
      uVar19 = (ulong)local_be;
    }
  }
  local_a8 = out;
  iVar9 = file_seekable(out);
  if (iVar9 == 0) {
    th06_compile_cold_1();
    iVar9 = 0;
  }
  else {
    __nmemb = (uVar3 & 0xffff) + uVar19;
    local_68 = (ulong)(uint)((int)__nmemb * 4);
    file_seek(out,(ulong)(7 < uVar1) * 4 + 4 + local_68);
    local_b0 = calloc(__nmemb,4);
    local_bc = 0xffff;
    if (ecl->version == 6) {
      local_bc = 0x87;
    }
    local_60 = (void *)((long)local_b0 + uVar19 * 4);
    local_98 = 0;
    plVar13 = (list_node_t *)&ecl->subs;
    while (plVar13 = plVar13->next, plVar13 != (list_node_t *)0x0) {
      ptVar17 = (thecl_sub_t *)plVar13->data;
      local_58 = plVar13;
      lVar12 = file_tell(out);
      *(int *)((long)local_60 + local_98 * 4) = (int)lVar12;
      plVar13 = (list_node_t *)&ptVar17->instrs;
      local_b8 = ptVar17;
      while (plVar13 = plVar13->next, plVar13 != (list_node_t *)0x0) {
        pvVar4 = plVar13->data;
        iVar9 = *(int *)((long)pvVar4 + 0x34);
        local_50 = plVar13;
        buffer = (undefined4 *)malloc((long)iVar9);
        *buffer = *(undefined4 *)((long)pvVar4 + 0x38);
        *(undefined2 *)(buffer + 1) = *(undefined2 *)((long)pvVar4 + 0x10);
        *(short *)((long)buffer + 6) = (short)iVar9;
        if (*(int *)((long)pvVar4 + 0x3c) == 0xff) {
          *(undefined2 *)(buffer + 2) = 0xff00;
        }
        else {
          uVar7 = (ushort)(*(int *)((long)pvVar4 + 0x3c) << 8);
          *(ushort *)(buffer + 2) = uVar7;
          if ((ecl->version & 0xfffffffe) == 6) {
            *(ushort *)(buffer + 2) = uVar7 & 0xf00;
          }
        }
        iVar9 = 0;
        uVar8 = 0;
        if (ecl->version == 6) {
          uVar8 = 0xff;
        }
        *(undefined2 *)((long)buffer + 10) = uVar8;
        data = buffer + 3;
        plVar18 = (long *)((long)pvVar4 + 0x20);
        while (out = local_a8, plVar18 = (long *)*plVar18, plVar18 != (long *)0x0) {
          piVar5 = (int *)plVar18[2];
          if (piVar5[8] != 0) {
            *(ushort *)((long)buffer + 10) =
                 *(ushort *)((long)buffer + 10) | (ushort)(1 << ((byte)iVar9 & 0x1f));
          }
          iVar2 = *piVar5;
          if (iVar2 == 0x4e) {
            uVar10 = th06_find_sub(ecl,*(char **)(piVar5 + 4));
LAB_00117c1c:
            *data = uVar10;
            data = data + 1;
          }
          else {
            if (iVar2 == 0x6f) {
              iVar11 = label_offset(ptVar17,*(char **)(piVar5 + 4));
              uVar10 = iVar11 - *(int *)((long)pvVar4 + 0x40);
              goto LAB_00117c1c;
            }
            if (iVar2 == 0x6e) {
              uVar10 = th06_find_sub(ecl,*(char **)(piVar5 + 4));
              *(short *)data = (short)uVar10;
              data = (uint32_t *)((long)data + 2);
            }
            else if (piVar5[2] == 0x7a) {
              in = *(char **)(piVar5 + 4);
              if (g_ecl_encode_cp932 == true) {
                sVar14 = utf8_to_cp932_len(in);
                out_00 = (char *)malloc(sVar14 + 1);
                in = utf8_to_cp932(out_00,in);
              }
              uVar1 = ecl->version;
              if ((int)uVar1 < 8) {
                if (uVar1 == 6) {
                  data[4] = 0;
                  data[5] = 0;
                  data[6] = 0;
                  data[7] = 0;
                  data[0] = 0;
                  data[1] = 0;
                  data[2] = 0;
                  data[3] = 0;
                  *(undefined2 *)(data + 8) = 0;
                  strncpy((char *)data,in,0x22);
                  data = (uint32_t *)((long)data + 0x22);
                }
                else if (uVar1 == 7) {
LAB_00117cc5:
                  data[8] = 0;
                  data[9] = 0;
                  data[10] = 0;
                  data[0xb] = 0;
                  data[4] = 0;
                  data[5] = 0;
                  data[6] = 0;
                  data[7] = 0;
                  data[0] = 0;
                  data[1] = 0;
                  data[2] = 0;
                  data[3] = 0;
                  strncpy((char *)data,in,0x30);
                  uVar16 = 0xaa;
LAB_00117cf0:
                  util_xor((uchar *)data,0x30,uVar16,'\0','\0');
                  data = data + 0xc;
                }
              }
              else if (uVar1 == 8) {
                if (iVar9 - 5U < 2) {
                  data[0xc] = 0;
                  data[0xd] = 0;
                  data[0xe] = 0;
                  data[0xf] = 0;
                  data[8] = 0;
                  data[9] = 0;
                  data[10] = 0;
                  data[0xb] = 0;
                  data[4] = 0;
                  data[5] = 0;
                  data[6] = 0;
                  data[7] = 0;
                  data[0] = 0;
                  data[1] = 0;
                  data[2] = 0;
                  data[3] = 0;
                  strncpy((char *)data,in,0x40);
                  uVar16 = 0xee;
                  if (iVar9 == 5) {
                    uVar16 = 0xdd;
                  }
                  util_xor((uchar *)data,0x40,uVar16,'\0','\0');
                  data = data + 0x10;
                }
                else if (iVar9 - 3U < 2) {
                  data[8] = 0;
                  data[9] = 0;
                  data[10] = 0;
                  data[0xb] = 0;
                  data[4] = 0;
                  data[5] = 0;
                  data[6] = 0;
                  data[7] = 0;
                  data[0] = 0;
                  data[1] = 0;
                  data[2] = 0;
                  data[3] = 0;
                  strncpy((char *)data,in,0x30);
                  uVar16 = 0xbb;
                  if (iVar9 == 3) {
                    uVar16 = 0xaa;
                  }
                  goto LAB_00117cf0;
                }
              }
              else if (uVar1 == 0x5f) goto LAB_00117cc5;
              ptVar17 = local_b8;
              if (g_ecl_encode_cp932 == true) {
                free(in);
                ptVar17 = local_b8;
              }
            }
            else {
              local_88.val.m.data = (uchar *)*(undefined8 *)(piVar5 + 6);
              local_88.val.d = (double)*(undefined8 *)(piVar5 + 4);
              local_88._4_4_ = SUB84((ulong)*(undefined8 *)(piVar5 + 2) >> 0x20,0);
              local_88.type = *piVar5;
              sVar15 = value_to_data(&local_88,(uchar *)data,
                                     (long)buffer +
                                     ((long)*(int *)((long)pvVar4 + 0x34) - (long)data));
              data = (uint32_t *)((long)data + sVar15);
            }
          }
          iVar9 = iVar9 + 1;
        }
        file_write(local_a8,buffer,(ulong)*(ushort *)((long)buffer + 6));
        if (local_bc < *(ushort *)(buffer + 1)) {
          fprintf(_stderr,"%s: warning: opcode: id %hu was higher than the maximum %hu\n",argv0);
        }
        free(buffer);
        plVar13 = local_50;
      }
      file_write(out,&local_40,0xc);
      local_98 = local_98 + 1;
      plVar13 = local_58;
    }
    local_a0 = 0x4ffff;
    local_48 = 0xffffffff;
    ptVar17 = (thecl_sub_t *)0x0;
    while (plVar13 = local_90->next, plVar13 != (list_node_t *)0x0) {
      pvVar4 = plVar13->data;
      local_90 = plVar13;
      lVar12 = file_tell(out);
      *(int *)((long)local_b0 + (long)ptVar17 * 4) = (int)lVar12;
      plVar18 = (long *)((long)pvVar4 + 0x38);
      local_b8 = ptVar17;
      while (plVar18 = (long *)*plVar18, plVar18 != (long *)0x0) {
        lVar12 = plVar18[2];
        iVar9 = *(int *)(lVar12 + 0x34);
        buffer_00 = (undefined2 *)malloc((long)iVar9);
        *buffer_00 = *(undefined2 *)(lVar12 + 0x38);
        buffer_00[2] = *(undefined2 *)(lVar12 + 0x10);
        *(char *)(buffer_00 + 3) = (char)iVar9;
        if (ecl->version < 8) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(undefined1 *)(lVar12 + 0x3c);
        }
        *(undefined1 *)((long)buffer_00 + 7) = uVar6;
        data_00 = (uchar *)(buffer_00 + 4);
        plVar20 = (long *)(lVar12 + 0x20);
        bVar21 = false;
        while (out = local_a8, plVar20 = (long *)*plVar20, plVar20 != (long *)0x0) {
          piVar5 = (int *)plVar20[2];
          if (bVar21) {
            local_88.val.m.data = (uchar *)*(undefined8 *)(piVar5 + 6);
            local_88.val.d = (double)*(undefined8 *)(piVar5 + 4);
            local_88._4_4_ = SUB84((ulong)*(undefined8 *)(piVar5 + 2) >> 0x20,0);
            local_88.type = *piVar5;
            sVar15 = value_to_data(&local_88,data_00,
                                   (long)buffer_00 + ((long)*(int *)(lVar12 + 0x34) - (long)data_00)
                                  );
            data_00 = data_00 + sVar15;
            bVar21 = true;
          }
          else {
            if (*piVar5 == 0x6e) {
              uVar10 = th06_find_sub(ecl,*(char **)(piVar5 + 4));
              uVar8 = (undefined2)uVar10;
            }
            else {
              uVar8 = (undefined2)piVar5[4];
            }
            buffer_00[1] = uVar8;
            bVar21 = true;
          }
        }
        file_write(local_a8,buffer_00,(ulong)*(byte *)(buffer_00 + 3));
        free(buffer_00);
      }
      ptVar17 = (thecl_sub_t *)((long)&local_b8->name + 1);
      bVar21 = 7 < ecl->version;
      buffer_01 = &local_48;
      if (!bVar21) {
        buffer_01 = (undefined8 *)&local_a0;
      }
      file_write(out,buffer_01,(ulong)bVar21 * 4 + 4);
    }
    if ((ecl->version != 6) && (ecl->version != 9)) {
      lVar12 = file_tell(out);
      *(int *)((long)local_b0 + (long)ptVar17 * 4) = (int)lVar12;
    }
    file_seek(out,0);
    if (7 < ecl->version) {
      file_write(out,&local_9c,4);
    }
    file_write(out,&local_c0,4);
    pvVar4 = local_b0;
    file_write(out,local_b0,local_68);
    free(pvVar4);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

static int
th06_compile(
    const thecl_t* ecl,
    FILE* out)
{
    const uint32_t magic = ecl->version == 9 ? 0x00000900 : 0x00000800;
    const size_t header_size = sizeof(th06_header_t) + ((ecl->version >= 8) ? sizeof(uint32_t) : 0);

    th06_header_t header = {
        .sub_count = ecl->sub_count
    };
    uint32_t* offsets;
    const th06_instr_t sentinel = {
        .time = 0xffffffff,
        .id = 0xffff,
        .size = sizeof(sentinel),
        .rank_mask = 0xff00,
        .param_mask = 0x00ff
    };

    thecl_timeline_t* iter_timeline;
    list_for_each(&ecl->timelines, iter_timeline)
        ++header.timeline_count;

    size_t timeline_count;
    if (ecl->version == 9)
        timeline_count = header.timeline_count;
    else if (ecl->version == 6) {
        timeline_count = 3;
        header.timeline_count = 0;
    } else
        timeline_count = 16;
    const size_t offset_count = timeline_count + header.sub_count;

    if (!file_seekable(out)) {
        fprintf(stderr, "%s: output is not seekable\n", argv0);
        return 0;
    }

    file_seek(out, header_size + offset_count * sizeof(uint32_t));

    offsets = calloc(offset_count, sizeof(*offsets));

    thecl_sub_t* sub;
    uint16_t max_opcode;
    /* TODO: Get max opcodes for the rest of the games */
    switch (ecl->version)
    {
    case 6:
        max_opcode = 135;
        break;
    default:
        max_opcode = 0xFFFFU;
        break;
    }
    size_t s = 0;
    list_for_each(&ecl->subs, sub) {
        offsets[timeline_count + s] = file_tell(out);

        thecl_instr_t* instr;
        list_for_each(&sub->instrs, instr) {
            th06_instr_t* raw_instr = th06_instr_serialize(ecl, sub, instr);
            file_write(out, raw_instr, raw_instr->size);
            if (raw_instr->id > max_opcode) {
                fprintf(stderr, "%s: warning: opcode: id %hu was higher than the maximum %hu\n", argv0, raw_instr->id, max_opcode);
            }
            free(raw_instr);
        }

        file_write(out, &sentinel, sizeof(sentinel));

        ++s;
    }

    char timeline_sentinel_th6[4] = {0xff, 0xff, 0x04, 0x00};
    char timeline_sentinel_th8[8] = {0xff, 0xff, 0xff, 0xff, 0x00, 0x00, 0x00, 0x00};

    size_t o = 0;
    thecl_sub_t* timeline;
    list_for_each(&ecl->timelines, timeline) {
        offsets[o++] = file_tell(out);

        thecl_instr_t* instr;
        list_for_each(&timeline->instrs, instr) {
            th06_timeline_instr_t* raw_instr = th06_timeline_instr_serialize(ecl, instr);

            file_write(out, raw_instr, raw_instr->size);
            free(raw_instr);
        }

        file_write(out, ecl->version < 8 ? timeline_sentinel_th6 : timeline_sentinel_th8, ecl->version < 8 ? 4 : 8);
    }

    if (ecl->version != 9 && ecl->version != 6)
        offsets[o] = file_tell(out);

    file_seek(out, 0);
    if (ecl->version >= 8)
        file_write(out, &magic, sizeof(magic));
    file_write(out, &header, sizeof(header));
    file_write(out, offsets, offset_count * sizeof(*offsets));
    free(offsets);

    return 1;
}